

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel.cpp
# Opt level: O1

int __thiscall
ncnn::ShuffleChannel::forward(ShuffleChannel *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _c;
  int _w;
  int _h;
  size_t _elemsize;
  uint uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  
  _c = bottom_blob->c;
  uVar1 = _c / this->group;
  iVar4 = -100;
  if (_c == this->group * uVar1) {
    _w = bottom_blob->w;
    _h = bottom_blob->h;
    _elemsize = bottom_blob->elemsize;
    Mat::create(top_blob,_w,_h,_c,_elemsize,opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (this->group != 0) {
        lVar5 = 0;
        lVar2 = 0;
        do {
          if (uVar1 != 0) {
            uVar3 = 0;
            do {
              memcpy((void *)(((long)(int)uVar3 * (long)this->group + lVar2) * top_blob->cstep *
                              top_blob->elemsize + (long)top_blob->data),
                     (void *)((uVar3 + lVar5) * bottom_blob->cstep * bottom_blob->elemsize +
                             (long)bottom_blob->data),_elemsize * (long)(_h * _w));
              uVar3 = uVar3 + 1;
            } while (uVar1 != uVar3);
          }
          lVar2 = lVar2 + 1;
          lVar5 = lVar5 + (int)uVar1;
        } while (this->group != (int)lVar2);
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int ShuffleChannel::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int chs_per_group = c / group;

    if (c != chs_per_group * group)
    {
        // reject invalid group
        return -100;
    }

    top_blob.create(w, h, c, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const size_t feature_sz = w * h * elemsize;
    for (int i = 0; i != group; i++)
    {
        for (int j = 0; j != chs_per_group; j++)
        {
            int src_q = chs_per_group * i + j;
            int dst_q = group * j + i;
            memcpy(top_blob.channel(dst_q), bottom_blob.channel(src_q), feature_sz);
        }
    }
    return 0;
}